

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  u8 uVar7;
  int iVar8;
  size_t __n;
  u16 uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    iVar8 = 1000000000;
  }
  else {
    iVar8 = pMem->db->aLimit[0];
  }
  uVar10 = 2;
  if (enc == '\0') {
    uVar10 = 0x10;
  }
  if (n < 0) {
    if (enc == '\x01') {
      uVar4 = sqlite3Strlen30(z);
      uVar11 = (ulong)(iVar8 + 1);
      if ((int)uVar4 <= iVar8) {
        uVar11 = (ulong)uVar4;
      }
    }
    else {
      for (uVar11 = 0; ((long)uVar11 <= (long)iVar8 && (z[uVar11 + 1] != '\0' || z[uVar11] != '\0'))
          ; uVar11 = uVar11 + 2) {
      }
    }
    n = (int)uVar11;
    uVar10 = uVar10 | 0x200;
  }
  uVar9 = (u16)uVar10;
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    iVar6 = 0;
    if (uVar10 >> 9 != 0) {
      iVar6 = (enc != '\x01') + 1;
    }
    if (iVar8 < n) {
      return 0x12;
    }
    iVar6 = iVar6 + n;
    iVar5 = 0x20;
    if (0x20 < iVar6) {
      iVar5 = iVar6;
    }
    iVar5 = sqlite3VdbeMemClearAndResize(pMem,iVar5);
    if (iVar5 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(long)iVar6);
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    if (xDel == sqlite3MallocSize) {
      pMem->zMalloc = z;
      iVar6 = sqlite3DbMallocSize(pMem->db,z);
      pMem->szMalloc = iVar6;
    }
    else {
      pMem->xDel = xDel;
      uVar9 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar9 + 0x400;
    }
  }
  pMem->n = n;
  pMem->flags = uVar9;
  uVar7 = '\x01';
  if (1 < enc) {
    uVar7 = enc;
  }
  pMem->enc = uVar7;
  if ((1 < enc) && (1 < n)) {
    cVar2 = *pMem->z;
    cVar3 = pMem->z[1];
    uVar7 = '\x02';
    if ((cVar3 == -2 && cVar2 == -1) || (uVar7 = '\x03', cVar3 == -1 && cVar2 == -2)) {
      iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar6 != 0) {
        return 7;
      }
      __n = (long)pMem->n - 2;
      pMem->n = (int)__n;
      memmove(pMem->z,pMem->z + 2,__n);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar7;
    }
  }
  iVar6 = 0;
  if (iVar8 < n) {
    iVar6 = 0x12;
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = sqlite3Strlen30(z);
      if( nByte>iLimit ) nByte = iLimit+1;
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}